

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remove_Entity_R_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Remove_Entity_R_PDU::GetAsString_abi_cxx11_(Remove_Entity_R_PDU *this)

{
  long in_RSI;
  
  GetAsString_abi_cxx11_((KString *)this,(Remove_Entity_R_PDU *)(in_RSI + -0x50));
  return;
}

Assistant:

KString Remove_Entity_R_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Remove Entity-R PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << Reliability_Header::GetAsString()
       << "Request ID: " << m_ui32RequestID
       << "\n";

    return ss.str();
}